

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatdc.c
# Opt level: O2

boolean ecx_configdc(ecx_contextt *context)

{
  byte bVar1;
  ec_slavet *peVar2;
  ec_groupt *peVar3;
  int iVar4;
  uint8 uVar5;
  uint8 port;
  int32 iVar6;
  int32 iVar7;
  int32 iVar8;
  int32 iVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  uint16 uVar13;
  int iVar14;
  int iVar15;
  uint16 uVar16;
  ulong uVar17;
  uint16 slave;
  ulong uVar18;
  byte bVar19;
  int32 ht;
  int8 plist [4];
  int32 tlist [4];
  int64 hrt;
  
  context->slavelist->hasdc = '\0';
  context->grouplist->hasdc = '\0';
  ht = 0;
  ecx_BWR(context->port,0,0x900,4,&ht,2000);
  uVar18 = 1;
  uVar12 = 0;
  uVar16 = 0;
  do {
    uVar13 = (uint16)uVar12;
    slave = (uint16)uVar18;
    uVar11 = uVar18 & 0xffff;
    peVar2 = context->slavelist;
    if (*context->slavecount < (int)uVar11) {
      return peVar2->hasdc;
    }
    peVar2[uVar11].consumedports = peVar2[uVar11].activeports;
    if (peVar2[uVar11].hasdc == '\0') {
      peVar2[uVar11].DCrtA = 0;
      peVar2[uVar11].DCrtB = 0;
      peVar2[uVar11].DCrtC = 0;
      peVar2[uVar11].DCrtD = 0;
      uVar10 = peVar2[uVar11].parent;
      if ((((ulong)uVar10 != 0) && (2 < peVar2[uVar10].topology)) || (uVar10 = uVar16, uVar16 != 0))
      {
        if (peVar2[uVar11].topology != '\x01') goto LAB_001092e9;
        ecx_parentport(context,uVar10);
      }
      uVar10 = 0;
    }
    else {
      if (peVar2->hasdc == '\0') {
        peVar2->hasdc = '\x01';
        peVar2->DCnext = slave;
        peVar3 = context->grouplist;
        peVar3->hasdc = '\x01';
        peVar3->DCnext = slave;
        uVar13 = 0;
      }
      else {
        peVar2[uVar12 & 0xffff].DCnext = slave;
      }
      peVar2[uVar11].DCprevious = uVar13;
      uVar16 = peVar2[uVar11].configadr;
      ecx_FPRD(context->port,uVar16,0x900,4,&ht,2000);
      context->slavelist[uVar11].DCrtA = ht;
      ecx_FPRD(context->port,uVar16,0x918,8,&hrt,2000);
      hrt = -hrt;
      ecx_FPWR(context->port,uVar16,0x920,8,&hrt,2000);
      ecx_FPRD(context->port,uVar16,0x904,4,&ht,2000);
      context->slavelist[uVar11].DCrtB = ht;
      ecx_FPRD(context->port,uVar16,0x908,4,&ht,2000);
      context->slavelist[uVar11].DCrtC = ht;
      ecx_FPRD(context->port,uVar16,0x90c,4,&ht,2000);
      peVar2 = context->slavelist;
      peVar2[uVar11].DCrtD = ht;
      bVar1 = peVar2[uVar11].activeports;
      bVar19 = (bVar1 & 1) != 0;
      if ((bool)bVar19) {
        plist[0] = '\0';
        tlist[0] = peVar2[uVar11].DCrtA;
      }
      if ((bVar1 & 8) != 0) {
        plist[bVar19] = '\x03';
        tlist[bVar19] = ht;
        bVar19 = bVar19 + 1;
      }
      if ((bVar1 & 2) != 0) {
        plist[bVar19] = '\x01';
        tlist[bVar19] = peVar2[uVar11].DCrtB;
        bVar19 = bVar19 + 1;
      }
      if ((bVar1 & 4) != 0) {
        plist[bVar19] = '\x02';
        tlist[bVar19] = peVar2[uVar11].DCrtC;
        bVar19 = bVar19 + 1;
      }
      uVar12 = 0;
      if (1 < bVar19) {
        uVar12 = (ulong)(tlist[1] < tlist[0]);
      }
      if (2 < bVar19) {
        uVar12 = (ulong)(tlist[1] < tlist[0]);
        if (tlist[2] < tlist[tlist[1] < tlist[0]]) {
          uVar12 = 2;
        }
        if ((bVar19 != 3) && (tlist[3] < tlist[uVar12])) {
          uVar12 = 3;
        }
      }
      bVar1 = plist[uVar12];
      peVar2[uVar11].entryport = bVar1;
      peVar2[uVar11].consumedports = peVar2[uVar11].consumedports & ~(byte)(1 << (bVar1 & 0x1f));
      uVar12 = uVar18;
      do {
        uVar17 = uVar12 & 0xffff;
        uVar10 = peVar2[uVar17].parent;
        uVar12 = (ulong)uVar10;
        if (uVar12 == 0) goto LAB_001092df;
      } while (peVar2[uVar12].hasdc == '\0');
      uVar5 = ecx_parentport(context,uVar10);
      peVar2 = context->slavelist;
      peVar2[uVar11].parentport = uVar5;
      if (peVar2[uVar12].topology == '\x01') {
        uVar5 = peVar2[uVar12].entryport;
        peVar2[uVar11].parentport = uVar5;
      }
      iVar6 = ecx_porttime(context,uVar10,uVar5);
      uVar5 = ecx_prevport(context,uVar10,uVar5);
      iVar7 = ecx_porttime(context,uVar10,uVar5);
      iVar15 = 0;
      if (1 < peVar2[uVar11].topology) {
        uVar5 = peVar2[uVar11].entryport;
        port = ecx_prevport(context,slave,uVar5);
        iVar8 = ecx_porttime(context,slave,port);
        iVar9 = ecx_porttime(context,slave,uVar5);
        iVar15 = iVar8 - iVar9;
      }
      iVar4 = -iVar15;
      if (iVar6 - iVar7 < iVar15) {
        iVar4 = iVar15;
      }
      iVar15 = 0;
      if (1 < (int)((int)uVar17 - (uint)uVar10)) {
        iVar8 = ecx_porttime(context,uVar10,peVar2[uVar12].entryport);
        iVar14 = iVar7 - iVar8;
        iVar15 = -iVar14;
        if (0 < iVar14) {
          iVar15 = iVar14;
        }
      }
      ht = (iVar4 + (iVar6 - iVar7)) / 2 + iVar15 + peVar2[uVar12].pdelay;
      peVar2[uVar11].pdelay = ht;
      ecx_FPWR(context->port,uVar16,0x928,4,&ht,2000);
LAB_001092df:
      uVar10 = 0;
      uVar12 = uVar18;
    }
LAB_001092e9:
    uVar18 = (ulong)((int)uVar18 + 1);
    uVar16 = uVar10;
  } while( true );
}

Assistant:

boolean ecx_configdc(ecx_contextt *context)
{
   uint16 i, wc, slaveh, parent, child;
   uint16 parenthold = 0;
   uint16 prevDCslave = 0;
   int32 ht, dt1, dt2, dt3;
   int64 hrt;
   uint8 entryport;
   int8 nlist;
   int8 plist[4];
   int32 tlist[4];

   context->slavelist[0].hasdc = FALSE;
   context->grouplist[0].hasdc = FALSE;
   ht = 0;
   ecx_BWR(context->port, 0, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);  /* latch DCrecvTimeA of all slaves */
   for (i = 1; i <= *(context->slavecount); i++)
   {
      context->slavelist[i].consumedports = context->slavelist[i].activeports;
      if (context->slavelist[i].hasdc)
      {
         if (!context->slavelist[0].hasdc)
         {
            context->slavelist[0].hasdc = TRUE;
            context->slavelist[0].DCnext = i;
            context->slavelist[i].DCprevious = 0;
            context->grouplist[0].hasdc = TRUE;
            context->grouplist[0].DCnext = i;
         }
         else
         {
            context->slavelist[prevDCslave].DCnext = i;
            context->slavelist[i].DCprevious = prevDCslave;
         }
         /* this branch has DC slave so remove parenthold */
         parenthold = 0;
         prevDCslave = i;
         slaveh = context->slavelist[i].configadr;
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME0, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtA = etohl(ht);
         /* 64bit latched DCrecvTimeA of each specific slave */
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCSOF, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         /* use it as offset in order to set local time around 0 */
         hrt = htoell(-etohll(hrt));
         /* save it in the offset register */
         wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSOFFSET, sizeof(hrt), &hrt, EC_TIMEOUTRET);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME1, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtB = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME2, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtC = etohl(ht);
         wc = ecx_FPRD(context->port, slaveh, ECT_REG_DCTIME3, sizeof(ht), &ht, EC_TIMEOUTRET);
         context->slavelist[i].DCrtD = etohl(ht);

         /* make list of active ports and their time stamps */
         nlist = 0;
         if (context->slavelist[i].activeports & PORTM0) 
         {
            plist[nlist] = 0;
            tlist[nlist] = context->slavelist[i].DCrtA;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM3) 
         {
            plist[nlist] = 3;
            tlist[nlist] = context->slavelist[i].DCrtD;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM1) 
         {
            plist[nlist] = 1;
            tlist[nlist] = context->slavelist[i].DCrtB;
            nlist++;
         }
         if (context->slavelist[i].activeports & PORTM2) 
         {
            plist[nlist] = 2;
            tlist[nlist] = context->slavelist[i].DCrtC;
            nlist++;
         }
         /* entryport is port with the lowest timestamp */
         entryport = 0;
         if((nlist > 1) && (tlist[1] < tlist[entryport]))
         {
            entryport = 1;
         }         
         if((nlist > 2) && (tlist[2] < tlist[entryport]))
         {
            entryport = 2;
         }
         if((nlist > 3) && (tlist[3] < tlist[entryport]))
         {
            entryport = 3;
         }
         entryport = plist[entryport];
         context->slavelist[i].entryport = entryport;
         /* consume entryport from activeports */
         context->slavelist[i].consumedports &= (uint8)~(1 << entryport);

         /* finding DC parent of current */
         parent = i;
         do
         {
            child = parent;
            parent = context->slavelist[parent].parent;
         }
         while (!((parent == 0) || (context->slavelist[parent].hasdc)));
         /* only calculate propagation delay if slave is not the first */
         if (parent > 0)
         {
            /* find port on parent this slave is connected to */
            context->slavelist[i].parentport = ecx_parentport(context, parent);
            if (context->slavelist[parent].topology == 1)
            {
               context->slavelist[i].parentport = context->slavelist[parent].entryport;
            }

            dt1 = 0;
            dt2 = 0;
            /* delta time of (parentport - 1) - parentport */
            /* note: order of ports is 0 - 3 - 1 -2 */
            /* non active ports are skipped */
            dt3 = ecx_porttime(context, parent, context->slavelist[i].parentport) -
                  ecx_porttime(context, parent, 
                    ecx_prevport(context, parent, context->slavelist[i].parentport));
            /* current slave has children */
            /* those childrens delays need to be substacted */
            if (context->slavelist[i].topology > 1)
            {
               dt1 = ecx_porttime(context, i, 
                        ecx_prevport(context, i, context->slavelist[i].entryport)) -
                     ecx_porttime(context, i, context->slavelist[i].entryport);
            }
            /* we are only interrested in positive diference */
            if (dt1 > dt3) dt1 = -dt1;
            /* current slave is not the first child of parent */
            /* previous childs delays need to be added */
            if ((child - parent) > 1)
            {
               dt2 = ecx_porttime(context, parent, 
                        ecx_prevport(context, parent, context->slavelist[i].parentport)) -
                     ecx_porttime(context, parent, context->slavelist[parent].entryport);
            }
            if (dt2 < 0) dt2 = -dt2;

            /* calculate current slave delay from delta times */
            /* assumption : forward delay equals return delay */
            context->slavelist[i].pdelay = ((dt3 - dt1) / 2) + dt2 +
               context->slavelist[parent].pdelay;
            ht = htoel(context->slavelist[i].pdelay);
            /* write propagation delay*/
            wc = ecx_FPWR(context->port, slaveh, ECT_REG_DCSYSDELAY, sizeof(ht), &ht, EC_TIMEOUTRET);
         }
      }
      else
      {
         context->slavelist[i].DCrtA = 0;
         context->slavelist[i].DCrtB = 0;
         context->slavelist[i].DCrtC = 0;
         context->slavelist[i].DCrtD = 0;
         parent = context->slavelist[i].parent;
         /* if non DC slave found on first position on branch hold root parent */
         if ( (parent > 0) && (context->slavelist[parent].topology > 2))
            parenthold = parent;
         /* if branch has no DC slaves consume port on root parent */
         if ( parenthold && (context->slavelist[i].topology == 1))
         {
            ecx_parentport(context, parenthold);
            parenthold = 0;
         }
      }
   }

   return context->slavelist[0].hasdc;
}